

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O1

descriptor_state *
std::experimental::net::v1::detail::object_pool_access::
create<std::experimental::net::v1::detail::epoll_reactor::descriptor_state,bool>(bool arg)

{
  descriptor_state *pdVar1;
  
  pdVar1 = (descriptor_state *)operator_new(0xa8);
  (pdVar1->super_operation).next_ = (scheduler_operation *)0x0;
  (pdVar1->super_operation).func_ =
       webfront::http::std::experimental::net::v1::detail::epoll_reactor::descriptor_state::
       do_complete;
  (pdVar1->super_operation).task_result_ = 0;
  webfront::http::std::experimental::net::v1::detail::conditionally_enabled_mutex::
  conditionally_enabled_mutex(&pdVar1->mutex_,arg);
  pdVar1->op_queue_[2].front_ = (reactor_op *)0x0;
  pdVar1->op_queue_[2].back_ = (reactor_op *)0x0;
  pdVar1->op_queue_[1].front_ = (reactor_op *)0x0;
  pdVar1->op_queue_[1].back_ = (reactor_op *)0x0;
  pdVar1->op_queue_[0].front_ = (reactor_op *)0x0;
  pdVar1->op_queue_[0].back_ = (reactor_op *)0x0;
  return pdVar1;
}

Assistant:

static Object* create(Arg arg)
  {
    return new Object(arg);
  }